

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O2

void __thiscall Cmd::cmdLoop(Cmd *this)

{
  bool bVar1;
  bool bVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  
  do {
    bVar2 = false;
    nextLine_abi_cxx11_((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&_Stack_48,this,false);
    bVar1 = _Stack_48._M_engaged;
    if (_Stack_48._M_engaged == true) {
      bVar2 = oneCmd(this,(string *)&_Stack_48);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&_Stack_48);
  } while ((bVar2 == false) && (bVar1 != false));
  return;
}

Assistant:

void cmdLoop() {
		bool stop = false;
		while (!stop) {
			std::optional<std::string> line = nextLine();
			if (!line) {
				break;
			}
			stop = oneCmd(*line);
		}
	}